

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField(MapFieldBase *this)

{
  State SVar1;
  ReflectionPayload *pRVar2;
  MutexLock lock;
  MutexLock local_18;
  
  SVar1 = state(this);
  if (SVar1 == STATE_MODIFIED_REPEATED) {
    pRVar2 = payload(this);
    local_18.mu_ = &pRVar2->mutex;
    absl::lts_20250127::Mutex::Lock(local_18.mu_);
    if ((pRVar2->state)._M_i == STATE_MODIFIED_REPEATED) {
      SyncMapWithRepeatedFieldNoLock(this);
      (pRVar2->state)._M_i = CLEAN;
    }
    absl::lts_20250127::MutexLock::~MutexLock(&local_18);
  }
  return;
}

Assistant:

void MapFieldBase::SyncMapWithRepeatedField() const {
  ConstAccess();
  // acquire here matches with release below to ensure that we can only see a
  // value of CLEAN after all previous changes have been synced.
  if (state() == STATE_MODIFIED_REPEATED) {
    auto& p = payload();
    {
      absl::MutexLock lock(&p.mutex);
      // Double check state, because another thread may have seen the same state
      // and done the synchronization before the current thread.
      if (p.state.load(std::memory_order_relaxed) == STATE_MODIFIED_REPEATED) {
        const_cast<MapFieldBase*>(this)->SyncMapWithRepeatedFieldNoLock();
        p.state.store(CLEAN, std::memory_order_release);
      }
    }
    ConstAccess();
  }
}